

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *pPVar1;
  Promise<void> *pPVar2;
  int *piVar3;
  long *plVar4;
  byte bVar5;
  uint uVar6;
  PromiseArenaMember *pPVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  SourceLocation location;
  bool bVar11;
  coroutine_handle<void> coroutine;
  long lVar12;
  undefined1 *__dest;
  undefined8 *puVar13;
  undefined1 *puVar14;
  size_t sVar15;
  undefined7 in_register_00000031;
  undefined8 in_R8;
  Mask mask;
  ulong in_R9;
  undefined1 *puVar16;
  size_t sVar17;
  size_t sVar18;
  size_t capacity;
  ArrayPtr<const_unsigned_char> AVar19;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_79;
  undefined1 local_78 [8];
  anon_union_24_1_a8a2e026_for_OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_2
  aStack_70;
  Coroutine<void> *local_58;
  undefined4 local_4c;
  char *local_48;
  undefined8 *local_40;
  PromiseBase local_38;
  
  lVar12 = CONCAT71(in_register_00000031,opcode);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  coroutine._M_fr_ptr = operator_new(0x680);
  *(code **)coroutine._M_fr_ptr = sendImpl;
  *(code **)((long)coroutine._M_fr_ptr + 8) = sendImpl;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x658) = in_R8;
  *(size_t *)((long)coroutine._M_fr_ptr + 0x650) = message.size_;
  *(char *)((long)coroutine._M_fr_ptr + 0x67f) = (char)message.ptr;
  *(long *)((long)coroutine._M_fr_ptr + 0x648) = lVar12;
  local_78 = (undefined1  [8])0x4f0126;
  aStack_70._0_8_ = "sendImpl";
  aStack_70._8_8_ = 0x1500000dae;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  location.function = "sendImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xdae;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  ((PromiseArenaMember *)local_38.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)this_00;
  local_79.value = (bool)(*(byte *)(lVar12 + 0x161) ^ 1);
  local_58 = this_00;
  if (*(byte *)(lVar12 + 0x161) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              ((Fault *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdaf,FAILED,"!disconnected",
               "_kjCondition,\"WebSocket can\'t send after disconnect()\"",&local_79,
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    kj::_::Debug::Fault::fatal((Fault *)local_78);
  }
  local_79.value = (bool)(*(byte *)(lVar12 + 0x162) ^ 1);
  if (*(byte *)(lVar12 + 0x162) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
              ((Fault *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xdb0,FAILED,"!currentlySending",
               "_kjCondition,\"another message send is already in progress\"",&local_79,
               (char (*) [44])"another message send is already in progress");
    kj::_::Debug::Fault::fatal((Fault *)local_78);
  }
  *(undefined1 *)(lVar12 + 0x162) = 1;
  lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
  if (*(char *)(lVar12 + 0x348) == '\x01') {
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    pPVar2 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x638);
    do {
      bVar5 = *(byte *)(lVar12 + 0x161);
      ((DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x67e))->value = (bool)(bVar5 ^ 1);
      if (bVar5 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                  ((Fault *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xdb7,FAILED,"!disconnected",
                   "_kjCondition,\"WebSocket can\'t send after disconnect()\"",
                   (DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x67e),
                   (char (*) [40])"WebSocket can\'t send after disconnect()");
        kj::_::Debug::Fault::fatal((Fault *)local_78);
      }
      (pPVar2->super_PromiseBase).node.ptr = *(PromiseNode **)(lVar12 + 0x350);
      *(undefined8 *)(lVar12 + 0x350) = 0;
      *(undefined1 *)(lVar12 + 0x348) = 0;
      co_await<void>(pPVar1,pPVar2);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x67c) = 0;
      bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)pPVar1,&local_58->super_CoroutineBase);
      if (bVar11) {
        return (Promise<void>)(PromiseNode *)local_38.node.ptr;
      }
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
      pPVar7 = &((pPVar2->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar7 != (PromiseArenaMember *)0x0) {
        (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar7);
      }
      lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
    } while (*(char *)(lVar12 + 0x348) != '\0');
  }
  *(byte *)(lVar12 + 0x160) =
       *(byte *)(lVar12 + 0x160) | *(char *)((long)coroutine._M_fr_ptr + 0x67f) == '\b';
  piVar3 = (int *)((long)coroutine._M_fr_ptr + 0x678);
  puVar13 = *(undefined8 **)(lVar12 + 0x20);
  if (puVar13 == (undefined8 *)0x0) {
    *piVar3 = 0;
  }
  else {
    (**(code **)*puVar13)(puVar13,piVar3,4);
  }
  local_48 = (char *)((long)coroutine._M_fr_ptr + 0x5f0);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0;
  if (((byte)(*(char *)((long)coroutine._M_fr_ptr + 0x67f) - 1U) < 2) &&
     (lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x648), *(char *)(lVar12 + 0x28) == '\x01')) {
    if (*(char *)(lVar12 + 0x60) == '\0') {
      local_78 = (undefined1  [8])0x0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x628) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x630) = 0;
      kj::_::Debug::Fault::init
                ((Fault *)local_78,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_78);
    }
    if (*(char *)(lVar12 + 0x30) == '\x01') {
      ZlibContext::reset((ZlibContext *)(lVar12 + 0x68));
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = in_R9;
    ZlibContext::processMessage
              ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)local_78,
               (ZlibContext *)(lVar12 + 0x68),
               *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x650),
               (Maybe<unsigned_long>)(auVar10 << 0x40),false);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5c8) = 1;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x5d0) = local_78._0_4_;
    if (local_78._0_4_ == 2) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = aStack_70._16_8_;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5d8) = aStack_70._0_8_;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = aStack_70._8_8_;
    }
    else if (local_78._0_4_ == 1) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5d8) = aStack_70._0_8_;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = aStack_70._8_8_;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8) = aStack_70._16_8_;
      aStack_70._0_8_ = (char *)0x0;
      aStack_70._8_8_ = 0;
    }
    OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy
              ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)local_78);
    uVar6 = ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)
            ((long)coroutine._M_fr_ptr + 0x5d0))->tag;
    puVar13 = (undefined8 *)(ulong)uVar6;
    if (uVar6 == 1) {
      if (*(char *)((long)coroutine._M_fr_ptr + 0x5f0) == '\x01') {
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0;
        lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8);
        if (lVar12 != 0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
          in_R9 = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar12,1);
        }
      }
      puVar14 = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5d8);
      uVar9 = *(ulong *)((long)coroutine._M_fr_ptr + 0x5e0);
      *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5f8) = puVar14;
      *(ulong *)((long)coroutine._M_fr_ptr + 0x600) = uVar9;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x608) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5d8) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5e0) = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 1;
      if (*(long *)((long)coroutine._M_fr_ptr + 0x658) == 0) {
        puVar14 = (undefined1 *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (1,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        *puVar14 = 0;
        if (*local_48 == '\x01') {
          *local_48 = '\0';
          lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8);
          if (lVar12 != 0) {
            *(long *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
            *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
            in_R9 = 0;
            (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                      (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar12,1);
          }
        }
        *(undefined1 **)((long)coroutine._M_fr_ptr + 0x5f8) = puVar14;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 1;
        puVar13 = &kj::_::HeapArrayDisposer::instance;
        *(undefined8 **)((long)coroutine._M_fr_ptr + 0x608) = &kj::_::HeapArrayDisposer::instance;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5f0) = 1;
        capacity = 1;
      }
      else {
        local_78._0_4_ = 0xffff0000;
        if (uVar9 < 4) {
          local_79.value = false;
LAB_0039e3a2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0xdde,FAILED,"innerMessage.asPtr().endsWith({0x00, 0x00, 0xFF, 0xFF})",
                     "_kjCondition,",&local_79);
          kj::_::Debug::Fault::fatal((Fault *)local_78);
        }
        puVar13 = (undefined8 *)(ulong)*(uint *)(puVar14 + (uVar9 - 4));
        local_79.value = *(uint *)(puVar14 + (uVar9 - 4)) == 0xffff0000;
        if (!local_79.value) goto LAB_0039e3a2;
        capacity = uVar9 - 4;
      }
    }
    else {
      if (uVar6 == 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::StringPtr&>
                  ((Fault *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xdd9,FAILED,(char *)0x0,
                   "\"Error compressing websocket message: \", error.description",
                   (char (*) [38])"Error compressing websocket message: ",
                   (StringPtr *)((long)coroutine._M_fr_ptr + 0x5e0));
        kj::_::Debug::Fault::fatal((Fault *)local_78);
      }
      puVar14 = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x650);
      capacity = *(size_t *)((long)coroutine._M_fr_ptr + 0x658);
    }
    local_4c = (undefined4)CONCAT71((int7)((ulong)puVar13 >> 8),1);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x5c8) == '\x01') {
      OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy
                ((OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)
                 ((long)coroutine._M_fr_ptr + 0x5d0));
    }
  }
  else {
    puVar14 = *(undefined1 **)((long)coroutine._M_fr_ptr + 0x650);
    capacity = *(size_t *)((long)coroutine._M_fr_ptr + 0x658);
    local_4c = 0;
  }
  mask.maskBytes = SUB84(in_R9,0);
  local_40 = (undefined8 *)((long)coroutine._M_fr_ptr + 0x610);
  *local_40 = 0;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x618) = 0;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
  if (*piVar3 == 0) {
    puVar13 = (undefined8 *)0x0;
    sVar17 = 0;
    __dest = (undefined1 *)0x0;
    sVar18 = capacity;
  }
  else {
    __dest = (undefined1 *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    puVar16 = __dest;
    if (capacity != 0) {
      puVar16 = __dest + capacity;
      memcpy(__dest,puVar14,capacity);
    }
    *(undefined1 **)((long)coroutine._M_fr_ptr + 0x610) = __dest;
    sVar17 = (long)puVar16 - (long)__dest;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x618) = sVar17;
    puVar13 = &kj::_::HeapArrayDisposer::instance;
    *(undefined8 **)((long)coroutine._M_fr_ptr + 0x620) = &kj::_::HeapArrayDisposer::instance;
    puVar14 = __dest;
    if (sVar17 == 0) {
      sVar17 = 0;
      sVar18 = 0;
    }
    else {
      sVar15 = 0;
      do {
        __dest[sVar15] = __dest[sVar15] ^ *(byte *)((long)piVar3 + (ulong)((uint)sVar15 & 3));
        sVar15 = sVar15 + 1;
        sVar18 = sVar17;
      } while (capacity != sVar15);
    }
  }
  *(undefined1 **)((long)coroutine._M_fr_ptr + 0x670) = __dest;
  *(size_t *)((long)coroutine._M_fr_ptr + 0x668) = sVar17;
  *(undefined8 **)((long)coroutine._M_fr_ptr + 0x660) = puVar13;
  lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
  AVar19 = Header::compose((Header *)(lVar12 + 0x163),local_4c._0_1_,
                           *(bool *)((long)coroutine._M_fr_ptr + 0x67f),(byte)sVar18,
                           (ulong)*(uint *)((long)coroutine._M_fr_ptr + 0x678),mask);
  *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x3f0) = AVar19;
  *(undefined1 **)((long)coroutine._M_fr_ptr + 0x400) = puVar14;
  *(size_t *)((long)coroutine._M_fr_ptr + 0x408) = sVar18;
  local_79.value = (*(byte *)(lVar12 + 0x163) & 0x30) == 0;
  if (local_79.value) {
    pPVar2 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x640);
    lVar12 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x648) + 0x18);
    (**(code **)(*(long *)(lVar12 + 8) + 8))(pPVar2,lVar12 + 8,(long)coroutine._M_fr_ptr + 0x3f0,2);
    pPVar1 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x410);
    co_await<void>(pPVar1,pPVar2);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x67c) = 1;
    bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar1,&local_58->super_CoroutineBase);
    if (!bVar11) {
      kj::_::PromiseAwaiter<void>::await_resume(pPVar1);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x430));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar1);
      pPVar7 = &((pPVar2->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar7 != (PromiseArenaMember *)0x0) {
        (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar7);
      }
      lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x648);
      *(undefined1 *)(lVar12 + 0x162) = 0;
      if (*(char *)(lVar12 + 0x310) == '\x01') {
        setUpSendingControlMessage(*(WebSocketImpl **)((long)coroutine._M_fr_ptr + 0x648));
      }
      plVar4 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x648) + 0x3a8);
      *plVar4 = *plVar4 + *(long *)((long)coroutine._M_fr_ptr + 0x408) +
                          *(long *)((long)coroutine._M_fr_ptr + 0x3f8);
      lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x670);
      if (lVar12 != 0) {
        puVar13 = *(undefined8 **)((long)coroutine._M_fr_ptr + 0x660);
        uVar8 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x668);
        *local_40 = 0;
        local_40[1] = 0;
        (**(code **)*puVar13)(puVar13,lVar12,1,uVar8,uVar8,0);
      }
      if ((*local_48 == '\x01') &&
         (lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x5f8), lVar12 != 0)) {
        uVar8 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f8) = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x608))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x608),lVar12,1,uVar8,uVar8,0);
      }
      kj::_::Coroutine<void>::fulfill(local_58,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x67d))
      ;
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x67c) = 2;
    }
    return (Promise<void>)(PromiseNode *)local_38.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[98]>
            ((Fault *)local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xdf9,FAILED,"!sendHeader.hasRsv2or3()",
             "_kjCondition,\"RSV bits 2 and 3 must be 0, as we do not currently \" \"support an extension that would set these bits\""
             ,&local_79,
             (char (*) [98])
             "RSV bits 2 and 3 must be 0, as we do not currently support an extension that would set these bits"
            );
  kj::_::Debug::Fault::fatal((Fault *)local_78);
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    for (;;) {
      KJ_IF_SOME(p, sendingControlMessage) {
        // Re-check in case of disconnect on a previous loop iteration.
        KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");

        // We recently sent a control message; make sure it's finished before proceeding.
        auto localPromise = kj::mv(p);
        sendingControlMessage = kj::none;
        co_await localPromise;
      } else {
        break;
      }
    }